

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void helicsCoreSetLogFile(HelicsCore core,char *logFileName,HelicsError *err)

{
  Core *pCVar1;
  long in_RSI;
  Core *cppcore;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *this;
  __sv_type local_30;
  char *pcStack_28;
  
  pCVar1 = getCore(in_stack_ffffffffffffffc8,(HelicsError *)in_stack_ffffffffffffffc0);
  if (pCVar1 != (Core *)0x0) {
    if (in_RSI == 0) {
      local_30 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffffc0)
      ;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (this,in_stack_ffffffffffffffc8);
    }
    (*pCVar1->_vptr_Core[0x59])(pCVar1,this,pcStack_28);
  }
  return;
}

Assistant:

void helicsCoreSetLogFile(HelicsCore core, const char* logFileName, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }
    try {
        cppcore->setLogFile(AS_STRING_VIEW(logFileName));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}